

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_blake256.c
# Opt level: O0

void blake256_update(state_conflict *S,uint8_t *data,uint64_t datalen)

{
  uint uVar1;
  uint8_t *in_RDX;
  state_conflict *in_RSI;
  long in_RDI;
  int fill;
  int left;
  int local_1c;
  
  local_1c = *(int *)(in_RDI + 0x38) >> 3;
  uVar1 = 0x40 - local_1c;
  if ((local_1c != 0) && ((ulong)uVar1 <= ((ulong)in_RDX >> 3 & 0x3f))) {
    memcpy((void *)(in_RDI + 0x40 + (long)local_1c),in_RSI,(long)(int)uVar1);
    *(int *)(in_RDI + 0x30) = *(int *)(in_RDI + 0x30) + 0x200;
    if (*(int *)(in_RDI + 0x30) == 0) {
      *(int *)(in_RDI + 0x34) = *(int *)(in_RDI + 0x34) + 1;
    }
    blake256_compress(in_RSI,in_RDX);
    in_RSI = (state_conflict *)((long)in_RSI->h + (long)(int)uVar1);
    in_RDX = in_RDX + -(long)(int)(uVar1 * 8);
    local_1c = 0;
  }
  for (; (uint8_t *)0x1ff < in_RDX; in_RDX = in_RDX + -0x200) {
    *(int *)(in_RDI + 0x30) = *(int *)(in_RDI + 0x30) + 0x200;
    if (*(int *)(in_RDI + 0x30) == 0) {
      *(int *)(in_RDI + 0x34) = *(int *)(in_RDI + 0x34) + 1;
    }
    blake256_compress(in_RSI,in_RDX);
    in_RSI = (state_conflict *)in_RSI->buf;
  }
  if (in_RDX == (uint8_t *)0x0) {
    *(undefined4 *)(in_RDI + 0x38) = 0;
  }
  else {
    memcpy((void *)(in_RDI + 0x40 + (long)local_1c),in_RSI,(ulong)in_RDX >> 3);
    *(int *)(in_RDI + 0x38) = local_1c * 8 + (int)in_RDX;
  }
  return;
}

Assistant:

void blake256_update(state *S, const uint8_t *data, uint64_t datalen) {
    int left = S->buflen >> 3;
    int fill = 64 - left;

    if (left && (((datalen >> 3) & 0x3F) >= (unsigned) fill)) {
        memcpy((void *) (S->buf + left), (void *) data, fill);
        S->t[0] += 512;
        if (S->t[0] == 0) S->t[1]++;
        blake256_compress(S, S->buf);
        data += fill;
        datalen -= (fill << 3);
        left = 0;
    }

    while (datalen >= 512) {
        S->t[0] += 512;
        if (S->t[0] == 0) S->t[1]++;
        blake256_compress(S, data);
        data += 64;
        datalen -= 512;
    }

    if (datalen > 0) {
        memcpy((void *) (S->buf + left), (void *) data, datalen >> 3);
        S->buflen = (left << 3) + (int) datalen;
    } else {
        S->buflen = 0;
    }
}